

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this,cmFindBaseDebugState *debug)

{
  undefined8 uVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  reference b;
  reference local_138;
  allocator<char> local_f9;
  string local_f8;
  undefined4 local_d4;
  string local_d0;
  string local_a0;
  reference local_80;
  string *sp;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *n;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string tryPath;
  cmFindBaseDebugState *debug_local;
  cmFindPathCommand *this_local;
  
  tryPath.field_2._8_8_ = debug;
  std::__cxx11::string::string((string *)&__range1);
  pvVar3 = &(this->super_cmFindBase).Names;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar3);
  n = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(pvVar3);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&n);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_f9);
      std::allocator<char>::~allocator(&local_f9);
LAB_006cb35c:
      local_d4 = 1;
      std::__cxx11::string::~string((string *)&__range1);
      return __return_storage_ptr__;
    }
    b = __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end1);
    pvVar3 = &(this->super_cmFindBase).super_cmFindCommon.SearchPaths;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar3);
    sp = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&sp), bVar2) {
      local_80 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>(&local_a0,local_80,b);
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      bVar2 = cmsys::SystemTools::FileExists((string *)&__range1);
      if (bVar2) {
        if ((this->IncludeFileInPath & 1U) == 0) {
          local_138 = local_80;
        }
        else {
          local_138 = (reference)&__range1;
        }
        bVar2 = cmFindBase::Validate(&this->super_cmFindBase,local_138);
        uVar1 = tryPath.field_2._8_8_;
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_d0);
          cmFindBaseDebugState::FoundAt((cmFindBaseDebugState *)uVar1,(string *)&__range1,&local_d0)
          ;
          std::__cxx11::string::~string((string *)&local_d0);
          if ((this->IncludeFileInPath & 1U) == 0) {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_80);
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&__range1);
          }
          goto LAB_006cb35c;
        }
      }
      uVar1 = tryPath.field_2._8_8_;
      std::__cxx11::string::string((string *)&local_f8);
      cmFindBaseDebugState::FailedAt((cmFindBaseDebugState *)uVar1,(string *)&__range1,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader(cmFindBaseDebugState& debug)
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = cmStrCat(sp, n);
      if (cmSystemTools::FileExists(tryPath) &&
          this->Validate(this->IncludeFileInPath ? tryPath : sp)) {
        debug.FoundAt(tryPath);
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
      debug.FailedAt(tryPath);
    }
  }
  return "";
}